

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O3

dtime_tz_t __thiscall
duckdb::Interval::Add(Interval *this,dtime_tz_t left,interval_t right,date_t *date)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = right._0_8_ % 86400000000 + ((ulong)this >> 0x18);
  if (lVar2 < 86400000000) {
    if (-1 < lVar2) goto LAB_012f93b8;
    lVar3 = 86400000000;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    lVar3 = -86400000000;
  }
  lVar2 = lVar2 + lVar3;
  *(int *)right.micros = *(int *)right.micros + iVar1;
LAB_012f93b8:
  return (dtime_tz_t)(lVar2 << 0x18 | (ulong)((uint)this & 0xffffff));
}

Assistant:

dtime_tz_t Interval::Add(dtime_tz_t left, interval_t right, date_t &date) {
	return dtime_tz_t(Interval::Add(left.time(), right, date), left.offset());
}